

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O1

int kftp_reconnect(knetFile *ftp)

{
  int iVar1;
  
  if (ftp->ctrl_fd != -1) {
    close(ftp->ctrl_fd);
    ftp->ctrl_fd = -1;
  }
  close(ftp->fd);
  ftp->fd = -1;
  iVar1 = kftp_connect(ftp);
  return iVar1;
}

Assistant:

int kftp_reconnect(knetFile *ftp)
{
	if (ftp->ctrl_fd != -1) {
		netclose(ftp->ctrl_fd);
		ftp->ctrl_fd = -1;
	}
	netclose(ftp->fd);
	ftp->fd = -1;
	return kftp_connect(ftp);
}